

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O2

ktx_bool_t ktxTexture2_NeedsTranscoding(ktxTexture2 *This)

{
  char cVar1;
  
  cVar1 = (char)This->pDfd[3];
  return cVar1 == -0x5a || cVar1 == -0x5d;
}

Assistant:

ktx_bool_t
ktxTexture2_NeedsTranscoding(ktxTexture2* This)
{
    if (KHR_DFDVAL(This->pDfd + 1, MODEL) == KHR_DF_MODEL_ETC1S)
        return true;
    else if (KHR_DFDVAL(This->pDfd + 1, MODEL) == KHR_DF_MODEL_UASTC)
        return true;
    else
        return false;
}